

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_node_short_edge
          (REF_GRID ref_grid,REF_INT node,REF_DBL *short_edge,REF_DBL *short_diag,REF_INT *short_id)

{
  REF_GEOM ref_geom;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT geom;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  REF_DBL diag;
  double local_48;
  undefined8 uStack_40;
  
  ref_geom = ref_grid->geom;
  *short_edge = 1.0;
  *short_diag = 1e+200;
  *short_id = -1;
  uVar4 = 0xffffffff;
  geom = -1;
  if (-1 < node) {
    pRVar1 = ref_geom->ref_adj;
    uVar4 = 0xffffffff;
    geom = -1;
    if (node < pRVar1->nnode) {
      uVar3 = pRVar1->first[(uint)node];
      uVar4 = 0xffffffff;
      geom = -1;
      if ((long)(int)uVar3 != -1) {
        geom = pRVar1->item[(int)uVar3].ref;
        uVar4 = (ulong)uVar3;
      }
    }
  }
  local_48 = 1e+200;
  uStack_40 = 0;
  dVar7 = -1e+200;
  do {
    if ((int)uVar4 == -1) {
      auVar5._0_8_ = dVar7 * 1e+20;
      auVar5._8_8_ = local_48;
      auVar6._8_8_ = -local_48;
      auVar6._0_8_ = -auVar5._0_8_;
      auVar6 = maxpd(auVar5,auVar6);
      if (auVar6._8_8_ < auVar6._0_8_) {
        *short_edge = local_48 / dVar7;
      }
      return 0;
    }
    dVar8 = dVar7;
    if (ref_geom->descr[geom * 6] == 1) {
      uVar3 = ref_egads_diagonal(ref_geom,geom,&diag);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xa74,"ref_geom_node_short_edge",(ulong)uVar3,"edge diag");
        return uVar3;
      }
      if (diag < local_48) {
        *short_diag = diag;
        *short_id = ref_geom->descr[(int)(geom * 6 | 1)];
        uStack_40 = 0;
        local_48 = diag;
      }
      dVar8 = diag;
      if (diag <= dVar7) {
        dVar8 = dVar7;
      }
    }
    pRVar2 = ref_geom->ref_adj->item;
    uVar4 = (ulong)pRVar2[(int)uVar4].next;
    geom = -1;
    dVar7 = dVar8;
    if (uVar4 != 0xffffffffffffffff) {
      geom = pRVar2[uVar4].ref;
    }
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_short_edge(REF_GRID ref_grid,
                                                   REF_INT node,
                                                   REF_DBL *short_edge,
                                                   REF_DBL *short_diag,
                                                   REF_INT *short_id) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, geom;
  REF_DBL diag, min_diag, max_diag;
  *short_edge = 1.0;
  *short_diag = REF_DBL_MAX;
  *short_id = REF_EMPTY;
  min_diag = REF_DBL_MAX;
  max_diag = REF_DBL_MIN;
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_EDGE != ref_geom_type(ref_geom, geom)) continue;
    RSS(ref_egads_diagonal(ref_geom, geom, &diag), "edge diag");
    if (diag < min_diag) {
      min_diag = diag;
      *short_diag = diag;
      *short_id = ref_geom_id(ref_geom, geom);
    }
    max_diag = MAX(diag, max_diag);
  }
  if (ref_math_divisible(min_diag, max_diag)) {
    *short_edge = min_diag / max_diag;
  }
  return REF_SUCCESS;
}